

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O3

bool __thiscall
DIS::DeadReckoningParameter::operator==(DeadReckoningParameter *this,DeadReckoningParameter *rhs)

{
  uchar idx;
  bool bVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = this->_deadReckoningAlgorithm == rhs->_deadReckoningAlgorithm;
  lVar3 = 0;
  do {
    bVar4 = (bool)(bVar4 & this->_otherParameters[lVar3] == rhs->_otherParameters[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xf);
  bVar1 = Vector3Float::operator==(&this->_entityLinearAcceleration,&rhs->_entityLinearAcceleration)
  ;
  bVar2 = Vector3Float::operator==(&this->_entityAngularVelocity,&rhs->_entityAngularVelocity);
  return (bool)((bVar2 && bVar1) & bVar4);
}

Assistant:

bool DeadReckoningParameter::operator ==(const DeadReckoningParameter& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_deadReckoningAlgorithm == rhs._deadReckoningAlgorithm) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 15; idx++)
     {
          if(!(_otherParameters[idx] == rhs._otherParameters[idx]) ) ivarsEqual = false;
     }

     if( ! (_entityLinearAcceleration == rhs._entityLinearAcceleration) ) ivarsEqual = false;
     if( ! (_entityAngularVelocity == rhs._entityAngularVelocity) ) ivarsEqual = false;

    return ivarsEqual;
 }